

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict compound_stmt(c2m_ctx_t c2m_ctx,int no_err_p)

{
  short sVar1;
  parse_ctx *ppVar2;
  token_t ptVar3;
  undefined8 uVar4;
  pos_t p;
  node_t_conflict op2;
  node_t_conflict pnVar5;
  size_t mark;
  node_t_conflict op;
  char *pcVar6;
  node *pnVar7;
  parse_ctx_t parse_ctx;
  
  ppVar2 = c2m_ctx->parse_ctx;
  ptVar3 = ppVar2->curr_token;
  if (*(short *)ptVar3 == 0x7b) {
    pcVar6 = (ptVar3->pos).fname;
    uVar4._0_4_ = (ptVar3->pos).lno;
    uVar4._4_4_ = (ptVar3->pos).ln_pos;
    p = ptVar3->pos;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    op2 = new_node(c2m_ctx,N_LIST);
    pnVar5 = new_node(c2m_ctx,N_LIST);
    pnVar5 = new_node2(c2m_ctx,N_BLOCK,pnVar5,op2);
    add_pos(c2m_ctx,pnVar5,p);
    pnVar7 = &err_struct;
    pnVar5->attr = ppVar2->curr_scope;
    ppVar2->curr_scope = pnVar5;
    while( true ) {
      sVar1 = *(short *)ppVar2->curr_token;
      if ((sVar1 == 0x7d) || (sVar1 == 0x13d)) break;
      mark = record_start((c2m_ctx_t)c2m_ctx->parse_ctx);
      op = declaration(c2m_ctx,1);
      record_stop(c2m_ctx,mark,(uint)(op == &err_struct));
      if ((op == &err_struct) && (op = stmt(c2m_ctx,no_err_p), op == &err_struct)) {
        error_recovery(c2m_ctx,1,"<statement>");
      }
      else {
        op_flat_append(c2m_ctx,op2,op);
      }
    }
    ppVar2->curr_scope = (node_t_conflict)pnVar5->attr;
    if (*(short *)ppVar2->curr_token == 0x13d) {
      error(c2m_ctx,0x1c1e80,pcVar6,uVar4);
    }
    else if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x7d) {
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      pnVar7 = pnVar5;
    }
    else if (ppVar2->record_level == 0) {
      pcVar6 = get_token_name(c2m_ctx,0x7d);
      syntax_error(c2m_ctx,pcVar6);
    }
  }
  else {
    error_recovery(c2m_ctx,0,"{");
    pnVar7 = &err_struct;
  }
  return pnVar7;
}

Assistant:

D (compound_stmt) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t n, list, r;
  pos_t pos;

  PTE ('{', pos, err0);
  list = new_node (c2m_ctx, N_LIST);
  n = new_pos_node2 (c2m_ctx, N_BLOCK, pos, new_node (c2m_ctx, N_LIST), list);
  n->attr = curr_scope;
  curr_scope = n;
  while (!C ('}') && !C (T_EOFILE)) { /* block-item-list, block_item */
    if ((r = TRY (declaration)) != err_node) {
    } else {
      PE (stmt, err1);
    }
    op_flat_append (c2m_ctx, list, r);
    continue;
  err1:
    error_recovery (c2m_ctx, 1, "<statement>");
  }
  curr_scope = n->attr;
  if (C (T_EOFILE)) {
    error (c2m_ctx, pos, "unfinished compound statement");
    return err_node;
  }
  PT ('}');
  return n;
err0:
  error_recovery (c2m_ctx, 0, "{");
  return err_node;
}